

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManPrintLutStats(Gia_Man_t *p)

{
  uint nSizeMax;
  int iVar1;
  int Id;
  int pCounts [33];
  
  memset(pCounts,0,0x84);
  nSizeMax = Gia_ManLutSizeMax(p);
  if (0x20 < (int)nSizeMax) {
    Abc_Print(1,"The max LUT size (%d) is too large.\n",(ulong)nSizeMax);
    return;
  }
  for (Id = 1; Id < p->nObjs; Id = Id + 1) {
    iVar1 = Gia_ObjIsLut(p,Id);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjLutSize(p,Id);
      pCounts[iVar1] = pCounts[iVar1] + 1;
    }
  }
  Gia_ManPrintNodeProfile(pCounts,nSizeMax);
  return;
}

Assistant:

void Gia_ManPrintLutStats( Gia_Man_t * p )
{
    int i, nSizeMax, pCounts[33] = {0};
    nSizeMax = Gia_ManLutSizeMax( p );
    if ( nSizeMax > 32 )
    {
        Abc_Print( 1, "The max LUT size (%d) is too large.\n", nSizeMax );
        return;
    }
    Gia_ManForEachLut( p, i )
        pCounts[ Gia_ObjLutSize(p, i) ]++;
    Gia_ManPrintNodeProfile( pCounts, nSizeMax );
}